

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O1

bool __thiscall
Omega_h::CmdLineFlag::parse_impl(CmdLineFlag *this,int *p_argc,char **argv,int i,bool should_print)

{
  int iVar1;
  pointer puVar2;
  CmdLineItem *pCVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  iterator __begin1;
  pointer puVar8;
  undefined7 in_register_00000081;
  bool bVar9;
  char local_4d;
  int local_4c;
  uint local_48;
  uint local_44;
  CmdLineFlag *local_40;
  int *local_38;
  
  local_48 = (uint)CONCAT71(in_register_00000081,should_print);
  iVar1 = *p_argc;
  iVar5 = iVar1 + -1;
  *p_argc = iVar5;
  if (i < iVar5) {
    lVar7 = (long)i + 1;
    do {
      argv[lVar7 + -1] = argv[lVar7];
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  puVar8 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_4c = i;
  local_38 = p_argc;
  if (iVar5 - i < (int)((ulong)((long)puVar2 - (long)puVar8) >> 3)) {
    if (should_print) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"flag ",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->super_CmdLineItem).name_._M_dataplus._M_p,
                          (this->super_CmdLineItem).name_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," takes ",7);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," arguments\n",0xb);
    }
    bVar9 = false;
  }
  else {
    bVar9 = puVar8 == puVar2;
    if (!bVar9) {
      local_44 = local_48 & 0xff;
      local_40 = this;
      do {
        bVar4 = CmdLineItem::parse((puVar8->_M_t).
                                   super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                   .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                   _M_head_impl,local_38,argv,i,SUB41(local_44,0));
        if (!bVar4) {
          if ((char)local_48 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"could not parse argument <",0x1a);
            pCVar3 = (puVar8->_M_t).
                     super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                     .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(pCVar3->name_)._M_dataplus._M_p,
                                (pCVar3->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"> of flag ",10);
            i = local_4c;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(local_40->super_CmdLineItem).name_._M_dataplus._M_p,
                                (local_40->super_CmdLineItem).name_._M_string_length);
            local_4d = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_4d,1);
          }
          if (!bVar4) {
            return bVar9;
          }
        }
        puVar8 = puVar8 + 1;
        bVar9 = puVar8 == puVar2;
      } while (!bVar9);
    }
  }
  return bVar9;
}

Assistant:

bool CmdLineFlag::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  shift(p_argc, argv, i);
  if (((*p_argc) - i) < int(args_.size())) {
    if (should_print) {
      std::cout << "flag " << name() << " takes " << args_.size()
                << " arguments\n";
    }
    return false;
  }
  for (auto const& the_arg : args_) {
    if (!the_arg->parse(p_argc, argv, i, should_print)) {
      if (should_print) {
        std::cout << "could not parse argument <" << the_arg->name()
                  << "> of flag " << name() << '\n';
      }
      return false;
    }
  }
  return true;
}